

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ImGuiTable *pIVar5;
  ImGuiID IVar6;
  ImGuiTable *__dest;
  int iVar7;
  
  uVar2 = (this->Buf).Size;
  uVar3 = this->FreeIdx;
  if (uVar3 == uVar2) {
    iVar1 = uVar2 + 1;
    iVar4 = (this->Buf).Capacity;
    if (iVar4 <= (int)uVar2) {
      if (iVar4 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar4 / 2 + iVar4;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      if (iVar4 < iVar7) {
        __dest = (ImGuiTable *)ImGui::MemAlloc((long)iVar7 * 0x218);
        pIVar5 = (this->Buf).Data;
        if (pIVar5 != (ImGuiTable *)0x0) {
          memcpy(__dest,pIVar5,(long)(this->Buf).Size * 0x218);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar7;
      }
    }
    (this->Buf).Size = iVar1;
    IVar6 = this->FreeIdx + 1;
  }
  else {
    if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar3)) goto LAB_001a04ea;
    IVar6 = (this->Buf).Data[uVar3].ID;
  }
  this->FreeIdx = IVar6;
  if ((-1 < (int)uVar3) && ((int)uVar3 < (this->Buf).Size)) {
    pIVar5 = (this->Buf).Data;
    memset(pIVar5 + uVar3,0,0x218);
    pIVar5[uVar3].LastFrameActive = -1;
    this->AliveCount = this->AliveCount + 1;
    if ((int)uVar3 < (this->Buf).Size) {
      return (this->Buf).Data + uVar3;
    }
  }
LAB_001a04ea:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                ,0x703,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }